

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipboard.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  GLFWwindow *window;
  int ch;
  char **argv_local;
  int argc_local;
  
  iVar1 = getopt(argc,argv,"h");
  if (iVar1 != -1) {
    if (iVar1 == 0x68) {
      usage();
      exit(0);
    }
    usage();
    exit(1);
  }
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    fprintf(_stderr,"Failed to initialize GLFW\n");
    exit(1);
  }
  handle = glfwCreateWindow(200,200,"Clipboard Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    glfwTerminate();
    fprintf(_stderr,"Failed to open GLFW window\n");
    exit(1);
  }
  glfwMakeContextCurrent(handle);
  gladLoadGLLoader(glfwGetProcAddress);
  glfwSwapInterval(1);
  glfwSetKeyCallback(handle,key_callback);
  glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
  (*glad_glClearColor)(0.5,0.5,0.5,0.0);
  while( true ) {
    iVar1 = glfwWindowShouldClose(handle);
    if (iVar1 != 0) break;
    (*glad_glClear)(0x4000);
    glfwSwapBuffers(handle);
    glfwWaitEvents();
  }
  glfwTerminate();
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    int ch;
    GLFWwindow* window;

    while ((ch = getopt(argc, argv, "h")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
    {
        fprintf(stderr, "Failed to initialize GLFW\n");
        exit(EXIT_FAILURE);
    }

    window = glfwCreateWindow(200, 200, "Clipboard Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();

        fprintf(stderr, "Failed to open GLFW window\n");
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    glfwSetKeyCallback(window, key_callback);
    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);

    glClearColor(0.5f, 0.5f, 0.5f, 0);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);

        glfwSwapBuffers(window);
        glfwWaitEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}